

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall
IR::LabelInstr::Init(LabelInstr *this,OpCode opcode,IRKind kind,Func *func,bool isOpHelper)

{
  code *pcVar1;
  bool bVar2;
  Func *pFVar3;
  undefined4 *puVar4;
  uint uVar5;
  bool isOpHelper_local;
  Func *func_local;
  IRKind kind_local;
  OpCode opcode_local;
  LabelInstr *this_local;
  
  Instr::Init(&this->super_Instr,opcode,kind,func);
  this->field_0x78 = this->field_0x78 & 0xfd | isOpHelper << 1;
  (this->m_pc).pc = (BYTE *)0x0;
  pFVar3 = Func::GetTopFunc(func);
  uVar5 = pFVar3->m_labelCount + 1;
  pFVar3->m_labelCount = uVar5;
  this->m_id = uVar5;
  if (this->m_id == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x63c,"(this->m_id != 0)","Label numbers wrapped around?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void
LabelInstr::Init(Js::OpCode opcode, IRKind kind, Func *func, bool isOpHelper)
{
    // Pass in the region when this is called from anywhere between the Lowerer and EHBailoutPatchUp code?
    __super::Init(opcode, kind, func);
    this->isOpHelper = isOpHelper;

    this->m_pc.pc = nullptr;
    this->m_id = ++(func->GetTopFunc()->m_labelCount);
    AssertMsg(this->m_id != 0, "Label numbers wrapped around?");
}